

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlCtxtResetLastError(void *ctx)

{
  xmlParserCtxtPtr ctxt;
  void *ctx_local;
  
  if ((ctx != (void *)0x0) &&
     (*(undefined4 *)((long)ctx + 0x88) = 0, *(int *)((long)ctx + 0x25c) != 0)) {
    xmlResetError((xmlErrorPtr)((long)ctx + 600));
  }
  return;
}

Assistant:

void
xmlCtxtResetLastError(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    if (ctxt == NULL)
        return;
    ctxt->errNo = XML_ERR_OK;
    if (ctxt->lastError.code == XML_ERR_OK)
        return;
    xmlResetError(&ctxt->lastError);
}